

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

uint32_t __thiscall
asmjit::CodeHolder::getLabelIdByName
          (CodeHolder *this,char *name,size_t nameLength,uint32_t parentId)

{
  uint32_t uVar1;
  int iVar2;
  ZoneHashNode *__s1;
  ZoneHashNode *pZVar3;
  ulong __n;
  uint uVar4;
  ulong local_30;
  
  local_30 = nameLength;
  uVar1 = anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&local_30);
  if ((local_30 != 0) &&
     (pZVar3 = (this->_namedLabels).super_ZoneHashBase._data
               [(ulong)uVar1 % (ulong)(this->_namedLabels).super_ZoneHashBase._bucketsCount],
     pZVar3 != (ZoneHashNode *)0x0)) {
    uVar4 = (uint)local_30;
    __n = local_30 & 0xffffffff;
    do {
      if (*(uint *)(pZVar3 + 0x30) == uVar4) {
        if (uVar4 < 0xc) {
          __s1 = pZVar3 + 0x34;
        }
        else {
          __s1 = *(ZoneHashNode **)(pZVar3 + 0x38);
        }
        iVar2 = bcmp(__s1,name,__n);
        if (iVar2 == 0) {
          return *(uint32_t *)(pZVar3 + 0xc);
        }
      }
      pZVar3 = *(ZoneHashNode **)pZVar3;
    } while (pZVar3 != (ZoneHashNode *)0x0);
  }
  return 0;
}

Assistant:

uint32_t CodeHolder::getLabelIdByName(const char* name, size_t nameLength, uint32_t parentId) noexcept {
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);
  if (ASMJIT_UNLIKELY(!nameLength)) return 0;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  return le ? le->getId() : static_cast<uint32_t>(0);
}